

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tsDemuxer.cpp
# Opt level: O0

bool isM2TSExt(string *streamName)

{
  bool bVar1;
  bool bVar2;
  bool bVar3;
  bool local_f2;
  allocator<char> local_d9;
  string local_d8;
  byte local_b3;
  byte local_b2;
  allocator<char> local_b1;
  string local_b0;
  allocator<char> local_89;
  string local_88;
  string local_58;
  undefined1 local_38 [8];
  string sName;
  string *streamName_local;
  
  sName.field_2._8_8_ = streamName;
  unquoteStr(&local_58,streamName);
  strToLowerCase((string *)local_38,&local_58);
  std::__cxx11::string::~string((string *)&local_58);
  std::allocator<char>::allocator();
  local_b2 = 0;
  local_b3 = 0;
  bVar2 = false;
  bVar1 = false;
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_88,".m2ts",&local_89);
  bVar3 = strEndWith((string *)local_38,&local_88);
  local_f2 = true;
  if (!bVar3) {
    std::allocator<char>::allocator();
    local_b2 = 1;
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_b0,".mts",&local_b1);
    local_b3 = 1;
    bVar3 = strEndWith((string *)local_38,&local_b0);
    local_f2 = true;
    if (!bVar3) {
      std::allocator<char>::allocator();
      bVar2 = true;
      std::__cxx11::string::string<std::allocator<char>>((string *)&local_d8,".ssif",&local_d9);
      bVar1 = true;
      local_f2 = strEndWith((string *)local_38,&local_d8);
    }
  }
  if (bVar1) {
    std::__cxx11::string::~string((string *)&local_d8);
  }
  if (bVar2) {
    std::allocator<char>::~allocator(&local_d9);
  }
  if ((local_b3 & 1) != 0) {
    std::__cxx11::string::~string((string *)&local_b0);
  }
  if ((local_b2 & 1) != 0) {
    std::allocator<char>::~allocator(&local_b1);
  }
  std::__cxx11::string::~string((string *)&local_88);
  std::allocator<char>::~allocator(&local_89);
  std::__cxx11::string::~string((string *)local_38);
  return local_f2;
}

Assistant:

bool isM2TSExt(const std::string& streamName)
{
    const string sName = strToLowerCase(unquoteStr(streamName));
    return strEndWith(sName, ".m2ts") || strEndWith(sName, ".mts") || strEndWith(sName, ".ssif");
}